

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::samplerCheck
          (TParseContext *this,TSourceLoc *loc,TType *type,TString *identifier,TIntermTyped *param_4
          )

{
  TType *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TSampler *pTVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  TString local_a8;
  TString local_80;
  TString local_58;
  TIntermTyped *local_30;
  TIntermTyped *param_4_local;
  TString *identifier_local;
  TType *type_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  local_30 = param_4;
  param_4_local = (TIntermTyped *)identifier;
  identifier_local = (TString *)type;
  type_local = (TType *)loc;
  loc_local = (TSourceLoc *)this;
  iVar3 = (*type->_vptr_TType[7])();
  if (iVar3 == 0xe) {
    pTVar5 = (TSampler *)
             (*(code *)(((identifier_local->_M_dataplus).super_allocator_type.allocator)->stack).
                       super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                       ._M_impl.super__Vector_impl_data._M_finish)();
    bVar2 = TSampler::isExternal(pTVar5);
    if (bVar2) {
      if ((this->super_TParseContextBase).super_TParseVersions.version < 300) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,type_local,1,&E_GL_OES_EGL_image_external,"samplerExternalOES");
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,type_local,1,&E_GL_OES_EGL_image_external_essl3,"samplerExternalOES");
      }
    }
  }
  pTVar5 = (TSampler *)
           (*(code *)(((identifier_local->_M_dataplus).super_allocator_type.allocator)->stack).
                     super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                     ._M_impl.super__Vector_impl_data._M_finish)();
  bVar2 = TSampler::isYuv(pTVar5);
  if (bVar2) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,type_local,1,&E_GL_EXT_YUV_target,"__samplerExternal2DY2YEXT");
  }
  lVar6 = (*(code *)((identifier_local->_M_dataplus).super_allocator_type.allocator)->totalBytes)();
  if (((uint)*(undefined8 *)(lVar6 + 8) & 0x7f) != 5) {
    iVar3 = (*(code *)(((identifier_local->_M_dataplus).super_allocator_type.allocator)->stack).
                      super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                      ._M_impl.super__Vector_impl_data._M_start)();
    if ((iVar3 == 0xf) &&
       (bVar2 = containsFieldWithBasicType(this,(TType *)identifier_local,EbtSampler), bVar2)) {
      uVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_ARB_bindless_texture");
      pTVar1 = type_local;
      if ((uVar4 & 1) == 0) {
        TType::getBasicTypeString_abi_cxx11_(&local_58,(TType *)identifier_local);
        pcVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (&local_58);
        pcVar8 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)param_4_local);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar1,"non-uniform struct contains a sampler or image:",pcVar7,pcVar8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_58);
      }
      else {
        pTVar5 = (TSampler *)
                 (*(code *)(((identifier_local->_M_dataplus).super_allocator_type.allocator)->stack)
                           .
                           super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                           ._M_impl.super__Vector_impl_data._M_finish)();
        bVar2 = TSampler::isImage(pTVar5);
        if (bVar2) {
          TIntermediate::setBindlessImageMode
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                     &this->currentCaller,AstRefTypeVar);
        }
        else {
          TIntermediate::setBindlessTextureMode
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                     &this->currentCaller,AstRefTypeVar);
        }
      }
    }
    else {
      iVar3 = (*(code *)(((identifier_local->_M_dataplus).super_allocator_type.allocator)->stack).
                        super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                        ._M_impl.super__Vector_impl_data._M_start)();
      if ((iVar3 == 0xe) &&
         (lVar6 = (*(code *)((identifier_local->_M_dataplus).super_allocator_type.allocator)->
                            totalBytes)(), ((uint)*(undefined8 *)(lVar6 + 8) & 0x7f) != 5)) {
        uVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_ARB_bindless_texture");
        if ((uVar4 & 1) == 0) {
          pTVar5 = (TSampler *)
                   (*(code *)(((identifier_local->_M_dataplus).super_allocator_type.allocator)->
                             stack).
                             super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                             ._M_impl.super__Vector_impl_data._M_finish)();
          bVar2 = TSampler::isAttachmentEXT(pTVar5);
          if ((bVar2) &&
             (lVar6 = (*(code *)((identifier_local->_M_dataplus).super_allocator_type.allocator)->
                                totalBytes)(), pTVar1 = type_local,
             ((uint)*(undefined8 *)(lVar6 + 8) & 0x7f) != 0x1f)) {
            TType::getBasicTypeString_abi_cxx11_(&local_80,(TType *)identifier_local);
            pcVar7 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str(&local_80);
            pcVar8 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)param_4_local);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,pTVar1,
                       "can only be used in tileImageEXT variables or function parameters:",pcVar7,
                       pcVar8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_80);
          }
          else {
            lVar6 = (*(code *)((identifier_local->_M_dataplus).super_allocator_type.allocator)->
                              totalBytes)();
            pTVar1 = type_local;
            if (((uint)*(undefined8 *)(lVar6 + 8) & 0x7f) != 0x1f) {
              TType::getBasicTypeString_abi_cxx11_(&local_a8,(TType *)identifier_local);
              pcVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(&local_a8);
              pcVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)param_4_local);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,pTVar1,
                         "sampler/image types can only be used in uniform variables or function parameters:"
                         ,pcVar7,pcVar8);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_a8);
            }
          }
        }
        else {
          pTVar5 = (TSampler *)
                   (*(code *)(((identifier_local->_M_dataplus).super_allocator_type.allocator)->
                             stack).
                             super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                             ._M_impl.super__Vector_impl_data._M_finish)();
          bVar2 = TSampler::isImage(pTVar5);
          if (bVar2) {
            TIntermediate::setBindlessImageMode
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                       &this->currentCaller,AstRefTypeVar);
          }
          else {
            TIntermediate::setBindlessTextureMode
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                       &this->currentCaller,AstRefTypeVar);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TParseContext::samplerCheck(const TSourceLoc& loc, const TType& type, const TString& identifier, TIntermTyped* /*initializer*/)
{
    // Check that the appropriate extension is enabled if external sampler is used.
    // There are two extensions. The correct one must be used based on GLSL version.
    if (type.getBasicType() == EbtSampler && type.getSampler().isExternal()) {
        if (version < 300) {
            requireExtensions(loc, 1, &E_GL_OES_EGL_image_external, "samplerExternalOES");
        } else {
            requireExtensions(loc, 1, &E_GL_OES_EGL_image_external_essl3, "samplerExternalOES");
        }
    }
    if (type.getSampler().isYuv()) {
        requireExtensions(loc, 1, &E_GL_EXT_YUV_target, "__samplerExternal2DY2YEXT");
    }

    if (type.getQualifier().storage == EvqUniform)
        return;

    if (type.getBasicType() == EbtStruct && containsFieldWithBasicType(type, EbtSampler)) {
        // For bindless texture, sampler can be declared as an struct member
        if (extensionTurnedOn(E_GL_ARB_bindless_texture)) {
            if (type.getSampler().isImage())
                intermediate.setBindlessImageMode(currentCaller, AstRefTypeVar);
            else
                intermediate.setBindlessTextureMode(currentCaller, AstRefTypeVar);
        }
        else {
            error(loc, "non-uniform struct contains a sampler or image:", type.getBasicTypeString().c_str(), identifier.c_str());
        }
    }
    else if (type.getBasicType() == EbtSampler && type.getQualifier().storage != EvqUniform) {
        // For bindless texture, sampler can be declared as an input/output/block member
        if (extensionTurnedOn(E_GL_ARB_bindless_texture)) {
            if (type.getSampler().isImage())
                intermediate.setBindlessImageMode(currentCaller, AstRefTypeVar);
            else
                intermediate.setBindlessTextureMode(currentCaller, AstRefTypeVar);
        }
        else {
            // non-uniform sampler
            // not yet:  okay if it has an initializer
            // if (! initializer)
            if (type.getSampler().isAttachmentEXT() && type.getQualifier().storage != EvqTileImageEXT)
                 error(loc, "can only be used in tileImageEXT variables or function parameters:", type.getBasicTypeString().c_str(), identifier.c_str());
             else if (type.getQualifier().storage != EvqTileImageEXT)
                 error(loc, "sampler/image types can only be used in uniform variables or function parameters:", type.getBasicTypeString().c_str(), identifier.c_str());
        }
    }
}